

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pnm_test(stbi__context *s)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  bool bVar3;
  
  psVar1 = s->img_buffer;
  psVar2 = s->img_buffer_end;
  if (psVar1 < psVar2) {
LAB_0013e066:
    s->img_buffer = psVar1 + 1;
    bVar3 = *psVar1 != 'P';
    psVar1 = psVar1 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar1 = s->img_buffer;
      psVar2 = s->img_buffer_end;
      goto LAB_0013e066;
    }
    bVar3 = true;
  }
  if (psVar2 <= psVar1) {
    if (s->read_from_callbacks == 0) goto LAB_0013e0b6;
    stbi__refill_buffer(s);
    psVar1 = s->img_buffer;
  }
  s->img_buffer = psVar1 + 1;
  if ((bool)(~bVar3 & 0xfd < (byte)(*psVar1 - 0x37))) {
    return 1;
  }
LAB_0013e0b6:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 0;
}

Assistant:

static int      stbi__pnm_test(stbi__context *s)
{
   char p, t;
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind( s );
       return 0;
   }
   return 1;
}